

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cc
# Opt level: O0

void kratos::AssertionRemoval::process_block(StmtBlock *block)

{
  bool bVar1;
  int iVar2;
  StatementType SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  reference psVar4;
  shared_ptr<kratos::Stmt> *stmt_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range2;
  Stmt *local_40;
  Stmt *stmt;
  uint64_t i;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  uint64_t stmt_count;
  StmtBlock *block_local;
  
  iVar2 = (*(block->super_Stmt).super_IRNode._vptr_IRNode[1])();
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)CONCAT44(extraout_var,iVar2);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &i);
  for (stmt = (Stmt *)0x0;
      stmt < stmts_to_remove.
             super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
      stmt = (Stmt *)((long)&(stmt->super_IRNode)._vptr_IRNode + 1)) {
    iVar2 = (*(block->super_Stmt).super_IRNode._vptr_IRNode[2])(block,stmt);
    local_40 = (Stmt *)CONCAT44(extraout_var_00,iVar2);
    SVar3 = Stmt::type(local_40);
    if (SVar3 == Assert) {
      std::enable_shared_from_this<kratos::Stmt>::shared_from_this
                ((enable_shared_from_this<kratos::Stmt> *)&__range2);
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)&i,(shared_ptr<kratos::Stmt> *)&__range2);
      std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)&__range2);
    }
  }
  __end2 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&i);
  stmt_1 = (shared_ptr<kratos::Stmt> *)
           std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           end((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)&i);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                *)&stmt_1);
    if (!bVar1) break;
    psVar4 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
             ::operator*(&__end2);
    (*(block->super_Stmt).super_IRNode._vptr_IRNode[10])(block,psVar4);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &i);
  return;
}

Assistant:

static void process_block(StmtBlock *block) {
        auto stmt_count = block->child_count();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto *stmt = reinterpret_cast<Stmt *>(block->get_child(i));
            if (stmt->type() == StatementType::Assert)
                stmts_to_remove.emplace_back(stmt->shared_from_this());
        }
        for (auto const &stmt : stmts_to_remove) {
            block->remove_stmt(stmt);
        }
    }